

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_mf.cc
# Opt level: O3

void mf_train<sparse_parameters>(gdmf *d,example *ec,sparse_parameters *weights)

{
  char cVar1;
  vw *pvVar2;
  byte *pbVar3;
  pointer pbVar4;
  char *pcVar5;
  ulong uVar6;
  vw_exception *this;
  string *i;
  pointer pbVar7;
  byte *pbVar8;
  ulong uVar9;
  bool bVar10;
  float fVar11;
  float update;
  float fVar12;
  stringstream __msg;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8;
  
  pvVar2 = d->all;
  fVar12 = pvVar2->eta;
  fVar11 = powf((float)pvVar2->sd->t + ec->weight,pvVar2->power_t);
  fVar12 = ((fVar12 / fVar11) / 3.0) * ec->weight;
  (*pvVar2->loss->_vptr_loss_function[2])((ec->pred).scalar,(ec->l).simple.label,fVar12,0x3f800000);
  fVar12 = fVar12 * pvVar2->l2_lambda;
  pbVar3 = (ec->super_example_predict).indices._end;
  for (pbVar8 = (ec->super_example_predict).indices._begin; pbVar8 != pbVar3; pbVar8 = pbVar8 + 1) {
    sd_offset_update<sparse_parameters>
              (weights,(features *)&(ec->super_example_predict).feature_space[*pbVar8].values,0,
               update,fVar12);
  }
  pbVar4 = (pvVar2->pairs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar7 = (pvVar2->pairs).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar4; pbVar7 = pbVar7 + 1) {
    pcVar5 = (pbVar7->_M_dataplus)._M_p;
    cVar1 = *pcVar5;
    if ((((ec->super_example_predict).feature_space[cVar1].values._end !=
          (ec->super_example_predict).feature_space[cVar1].values._begin) &&
        (cVar1 = pcVar5[1],
        (ec->super_example_predict).feature_space[cVar1].values._end !=
        (ec->super_example_predict).feature_space[cVar1].values._begin)) && (d->rank != 0)) {
      uVar9 = 1;
      do {
        sd_offset_update<sparse_parameters>
                  (weights,(features *)
                           &(ec->super_example_predict).feature_space[*(pbVar7->_M_dataplus)._M_p].
                            values,uVar9,(d->scalars)._begin[uVar9 * 2] * update,fVar12);
        uVar6 = (ulong)d->rank;
        bVar10 = uVar9 < uVar6;
        uVar9 = uVar9 + 1;
      } while (bVar10);
      if (uVar6 != 0) {
        uVar9 = 0;
        do {
          sd_offset_update<sparse_parameters>
                    (weights,(features *)
                             &(ec->super_example_predict).feature_space
                              [(pbVar7->_M_dataplus)._M_p[1]].values,uVar9 + uVar6 + 1,
                     (d->scalars)._begin[uVar9 * 2 + 1] * update,fVar12);
          uVar6 = (ulong)d->rank;
          uVar9 = uVar9 + 1;
        } while (uVar9 < uVar6);
      }
    }
  }
  if ((pvVar2->triples).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pvVar2->triples).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (&local_1a8,"cannot use triples in matrix factorization",0x2a);
    this = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (this,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/gd_mf.cc"
               ,0xe1,&local_1d8);
    __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  return;
}

Assistant:

void mf_train(gdmf& d, example& ec, T& weights)
{
  vw& all = *d.all;
  label_data& ld = ec.l.simple;

  // use final prediction to get update size
  // update = eta_t*(y-y_hat) where eta_t = eta/(3*t^p) * importance weight
  float eta_t = all.eta / powf((float)all.sd->t + ec.weight, (float)all.power_t) / 3.f * ec.weight;
  float update = all.loss->getUpdate(ec.pred.scalar, ld.label, eta_t, 1.);  // ec.total_sum_feat_sq);

  float regularization = eta_t * all.l2_lambda;

  // linear update
  for (features& fs : ec) sd_offset_update<T>(weights, fs, 0, update, regularization);

  // quadratic update
  for (string& i : all.pairs)
  {
    if (ec.feature_space[(int)i[0]].size() > 0 && ec.feature_space[(int)i[1]].size() > 0)
    {
      // update l^k weights
      for (size_t k = 1; k <= d.rank; k++)
      {
        // r^k \cdot x_r
        float r_dot_x = d.scalars[2 * k];
        // l^k <- l^k + update * (r^k \cdot x_r) * x_l
        sd_offset_update<T>(weights, ec.feature_space[(int)i[0]], k, update * r_dot_x, regularization);
      }
      // update r^k weights
      for (size_t k = 1; k <= d.rank; k++)
      {
        // l^k \cdot x_l
        float l_dot_x = d.scalars[2 * k - 1];
        // r^k <- r^k + update * (l^k \cdot x_l) * x_r
        sd_offset_update<T>(weights, ec.feature_space[(int)i[1]], k + d.rank, update * l_dot_x, regularization);
      }
    }
  }
  if (all.triples.begin() != all.triples.end())
    THROW("cannot use triples in matrix factorization");
}